

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

MTBDD mtbdd_makeleaf(uint32_t type,uint64_t value)

{
  int iVar1;
  MTBDD MVar2;
  ulong a;
  int created;
  int local_64;
  Task local_60;
  
  a = (ulong)type | 0x4000000000000000;
  iVar1 = sylvan_mt_has_custom_hash(type);
  if (iVar1 == 0) {
    MVar2 = llmsset_lookup(nodes,a,value,&local_64);
  }
  else {
    MVar2 = llmsset_lookupc(nodes,a,value,&local_64);
  }
  if (MVar2 == 0) {
    local_60.f = sylvan_gc_WRAP;
    local_60.thief = (_Worker *)0x1;
    lace_run_task(&local_60);
    if (iVar1 == 0) {
      MVar2 = llmsset_lookup(nodes,a,value,&local_64);
    }
    else {
      MVar2 = llmsset_lookupc(nodes,a,value,&local_64);
    }
    if (MVar2 == 0) {
      mtbdd_makeleaf_cold_1();
    }
  }
  return MVar2;
}

Assistant:

MTBDD
mtbdd_makeleaf(uint32_t type, uint64_t value)
{
    struct mtbddnode n;
    mtbddnode_makeleaf(&n, type, value);

    int custom = sylvan_mt_has_custom_hash(type);

    int created;
    uint64_t index = custom ? llmsset_lookupc(nodes, n.a, n.b, &created) : llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        RUN(sylvan_gc);

        index = custom ? llmsset_lookupc(nodes, n.a, n.b, &created) : llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "BDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(BDD_NODES_CREATED);
    else sylvan_stats_count(BDD_NODES_REUSED);

    return (MTBDD)index;
}